

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

void __thiscall NaVector::export_to_file(NaVector *this,char *szFilePath)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  undefined4 *puVar3;
  uint uVar4;
  
  if (szFilePath == (char *)0x0) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0;
  }
  else {
    __stream = fopen(szFilePath,"wt");
    if (__stream != (FILE *)0x0) {
      uVar1 = (*this->_vptr_NaVector[6])(this);
      uVar4 = 0;
      fprintf(__stream,"%u\n",(ulong)uVar1);
      iVar2 = (*this->_vptr_NaVector[6])(this);
      if (iVar2 != 0) {
        do {
          (*this->_vptr_NaVector[9])(this,(ulong)uVar4);
          fprintf(__stream,"%g\n");
          uVar4 = uVar4 + 1;
          uVar1 = (*this->_vptr_NaVector[6])(this);
        } while (uVar4 < uVar1);
      }
      fclose(__stream);
      return;
    }
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 5;
  }
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaVector::export_to_file (const char* szFilePath) const
{
    if(NULL == szFilePath)
        throw(na_null_pointer);

    FILE    *fp = fopen(szFilePath, "wt");
    if(NULL == fp)
        throw(na_cant_open_file);

    fprintf(fp, "%u\n", dim());

    unsigned    i;
    for(i = 0; i < dim(); ++i){
         fprintf(fp, "%g\n", get(i));
    }

    fclose(fp);
}